

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O3

void __thiscall
vkt::sr::anon_unknown_0::ShaderOperatorCase::ShaderOperatorCase
          (ShaderOperatorCase *this,TestContext *testCtx,char *caseName,char *description,
          bool isVertexCase,ShaderEvalFunc evalFunc,string *shaderOp,ShaderDataSpec *spec)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  DataType DVar5;
  pointer pcVar6;
  float fVar7;
  DataType DVar8;
  float fVar9;
  float fVar10;
  DataType DVar11;
  float fVar12;
  float fVar13;
  DataType DVar14;
  float fVar15;
  float fVar16;
  int iVar17;
  int iVar18;
  ShaderEvaluator *this_00;
  char *pcVar19;
  ostream *poVar20;
  size_t sVar21;
  ShaderValue *pSVar22;
  string *psVar23;
  int precision;
  char *pcVar24;
  undefined1 *puVar25;
  Precision PVar26;
  string *this_01;
  long lVar27;
  long lVar28;
  bool bVar29;
  bool bVar30;
  string header;
  string prefix;
  char *inputPrecision [3];
  size_type __dnew;
  ostringstream vtx;
  ostringstream frag;
  char *local_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  **local_550;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_548;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_540 [2];
  string local_530;
  string local_510;
  long *local_4f0;
  long local_4e8;
  long local_4e0 [2];
  string *local_4d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4c8;
  ShaderValue *local_4c0;
  undefined8 auStack_4b8 [4];
  string local_498 [3];
  ios_base local_428 [264];
  string local_320 [3];
  ios_base local_2b0 [264];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_498,caseName,(allocator<char> *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_320,description,(allocator<char> *)&local_550);
  this_00 = (ShaderEvaluator *)operator_new(0x28);
  uVar4 = *(undefined8 *)&spec->referenceScale;
  iVar17 = glu::getDataTypeScalarSize(spec->output);
  ShaderEvaluator::ShaderEvaluator(this_00);
  this_00->_vptr_ShaderEvaluator = (_func_int **)&PTR__ShaderEvaluator_00cf7640;
  this_00[1]._vptr_ShaderEvaluator = (_func_int **)evalFunc;
  *(int *)&this_00[1].m_evalFunc = iVar17;
  *(undefined8 *)((long)&this_00[1].m_evalFunc + 4) = uVar4;
  ShaderRenderCase::ShaderRenderCase
            (&this->super_ShaderRenderCase,testCtx,local_498,local_320,isVertexCase,this_00,
             (UniformSetup *)0x0,(AttributeSetupFunc)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320[0]._M_dataplus._M_p != &local_320[0].field_2) {
    operator_delete(local_320[0]._M_dataplus._M_p,local_320[0].field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,
                    CONCAT44(local_498[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_498[0].field_2._M_allocated_capacity) + 1);
  }
  (this->super_ShaderRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderOperatorCase_00cf75e0;
  fVar2 = spec->resultBias;
  fVar3 = spec->referenceScale;
  fVar7 = spec->referenceBias;
  PVar26 = spec->precision;
  DVar5 = spec->output;
  iVar17 = spec->numInputs;
  DVar8 = spec->inputs[0].type;
  fVar9 = spec->inputs[0].rangeMin;
  fVar10 = spec->inputs[0].rangeMax;
  DVar11 = spec->inputs[1].type;
  fVar12 = spec->inputs[1].rangeMin;
  fVar13 = spec->inputs[1].rangeMax;
  DVar14 = spec->inputs[2].type;
  fVar15 = spec->inputs[2].rangeMin;
  fVar16 = spec->inputs[2].rangeMax;
  (this->m_spec).resultScale = spec->resultScale;
  (this->m_spec).resultBias = fVar2;
  (this->m_spec).referenceScale = fVar3;
  (this->m_spec).referenceBias = fVar7;
  (this->m_spec).precision = PVar26;
  (this->m_spec).output = DVar5;
  (this->m_spec).numInputs = iVar17;
  (this->m_spec).inputs[0].type = DVar8;
  (this->m_spec).inputs[0].rangeMin = fVar9;
  (this->m_spec).inputs[0].rangeMax = fVar10;
  (this->m_spec).inputs[1].type = DVar11;
  (this->m_spec).inputs[1].rangeMin = fVar12;
  (this->m_spec).inputs[1].rangeMax = fVar13;
  (this->m_spec).inputs[2].type = DVar14;
  (this->m_spec).inputs[2].rangeMin = fVar15;
  (this->m_spec).inputs[2].rangeMax = fVar16;
  local_4d0 = &this->m_shaderOp;
  local_4c8 = &(this->m_shaderOp).field_2;
  (this->m_shaderOp)._M_dataplus._M_p = (pointer)local_4c8;
  pcVar6 = (shaderOp->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d0,pcVar6,pcVar6 + shaderOp->_M_string_length);
  PVar26 = (this->m_spec).precision;
  if (PVar26 == PRECISION_LAST) {
    local_558 = (char *)0x0;
  }
  else {
    local_558 = glu::getPrecisionName(PVar26);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  this_01 = local_1a8;
  if ((this->super_ShaderRenderCase).m_isVertexCase != false) {
    this_01 = local_320;
  }
  local_550 = local_540;
  local_498[0]._M_dataplus._M_p = &DAT_00000010;
  local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)std::__cxx11::string::_M_create((ulong *)&local_550,(ulong)local_498);
  local_540[0] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_498[0]._M_dataplus._M_p;
  *local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x6e6f697372657623;
  local_550[1] = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0xa73652030313320;
  local_548 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498[0]._M_dataplus._M_p;
  *(char *)((long)local_550 + (long)local_498[0]._M_dataplus._M_p) = '\0';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,(char *)local_550,(long)local_498[0]._M_dataplus._M_p);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,(char *)local_550,(long)local_548);
  if (0 < (this->m_spec).numInputs) {
    pSVar22 = (this->m_spec).inputs;
    lVar27 = 0;
    do {
      PVar26 = PRECISION_HIGHP;
      if (7 < pSVar22->type - TYPE_INT) {
        PVar26 = (this->m_spec).precision;
      }
      if (pSVar22->type - TYPE_BOOL < 4) {
        PVar26 = PRECISION_MEDIUMP;
      }
      pcVar19 = glu::getPrecisionName(PVar26);
      auStack_4b8[lVar27] = pcVar19;
      lVar27 = lVar27 + 1;
      pSVar22 = pSVar22 + 1;
    } while (lVar27 < (this->m_spec).numInputs);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"layout(location = 0) in highp vec4 a_position;\n",0x2f);
  if (0 < (this->m_spec).numInputs) {
    lVar27 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"layout(location = ",0x12);
      poVar20 = (ostream *)std::ostream::operator<<(local_320,(int)lVar27 + 4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,") in ",5);
      pcVar19 = (char *)auStack_4b8[lVar27];
      if (pcVar19 == (char *)0x0) {
        std::ios::clear((int)poVar20 + (int)*(undefined8 *)(*(long *)poVar20 + -0x18));
      }
      else {
        sVar21 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,pcVar19,sVar21);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," vec4 a_in",10);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)lVar27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,";\n",2);
      lVar27 = lVar27 + 1;
    } while (lVar27 < (this->m_spec).numInputs);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,"layout(location = 0) out mediump vec4 o_color;\n",0x2f);
  if ((this->super_ShaderRenderCase).m_isVertexCase == false) {
    lVar27 = 0;
    while (lVar27 < (this->m_spec).numInputs) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_320,"layout(location = ",0x12);
      iVar17 = (int)(lVar27 + 1);
      poVar20 = (ostream *)std::ostream::operator<<(local_320,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,") out ",6);
      pcVar19 = (char *)auStack_4b8[lVar27];
      if (pcVar19 == (char *)0x0) {
        std::ios::clear((int)poVar20 + (int)*(undefined8 *)(*(long *)poVar20 + -0x18));
      }
      else {
        sVar21 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,pcVar19,sVar21);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," vec4 v_in",10);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)lVar27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,";\n",2);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"layout(location = ",0x12);
      poVar20 = (ostream *)std::ostream::operator<<(local_1a8,iVar17);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,") in ",5);
      if (pcVar19 == (char *)0x0) {
        std::ios::clear((int)poVar20 + (int)*(undefined8 *)(*(long *)poVar20 + -0x18));
      }
      else {
        sVar21 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,pcVar19,sVar21);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," vec4 v_in",10);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar17 + -1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,";\n",2);
      lVar27 = lVar27 + 1;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"layout(location = 0) out mediump vec4 v_color;\n",0x2f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"layout(location = 0) in mediump vec4 v_color;\n",0x2e);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"{\n",2);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_320,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"void main()\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"{\n",2);
  pcVar19 = "v_";
  bVar29 = (this->super_ShaderRenderCase).m_isVertexCase != false;
  if (bVar29) {
    pcVar19 = "a_";
  }
  local_4f0 = local_4e0;
  pcVar24 = "";
  if (bVar29) {
    pcVar24 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,pcVar19,pcVar24);
  iVar17 = (int)this_01;
  if (0 < (this->m_spec).numInputs) {
    pSVar22 = (this->m_spec).inputs;
    puVar25 = sr::(anonymous_namespace)::s_inSwizzles;
    lVar27 = 0;
    do {
      DVar5 = pSVar22->type;
      local_4c0 = pSVar22;
      iVar18 = glu::getDataTypeScalarSize(DVar5);
      pcVar24 = glu::getDataTypeName(DVar5);
      pcVar19 = *(char **)(puVar25 + (long)(iVar18 + -1) * 8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
      uVar1 = DVar5 - TYPE_BOOL;
      if (local_558 != (char *)0x0 && 3 < uVar1) {
        sVar21 = strlen(local_558);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_558,sVar21);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," ",1);
      }
      if (pcVar24 == (char *)0x0) {
        std::ios::clear(iVar17 + (int)*(undefined8 *)((this_01->_M_dataplus)._M_p + -0x18));
      }
      else {
        sVar21 = strlen(pcVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar24,sVar21);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," in",3);
      poVar20 = (ostream *)std::ostream::operator<<(this_01,(int)lVar27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20," = ",3);
      if (uVar1 < 4) {
        pcVar24 = "greaterThan(";
        if (iVar18 == 1) {
          pcVar24 = "(";
        }
        lVar28 = 0xc;
        if (iVar18 == 1) {
          lVar28 = 1;
        }
LAB_005cadb0:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar24,lVar28);
      }
      else if (DVar5 - TYPE_INT < 8) {
        if (pcVar24 == (char *)0x0) {
          lVar28 = 1;
          std::ios::clear(iVar17 + (int)*(undefined8 *)((this_01->_M_dataplus)._M_p + -0x18));
          pcVar24 = "(";
        }
        else {
          sVar21 = strlen(pcVar24);
          lVar28 = 1;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar24,sVar21);
          pcVar24 = "(";
        }
        goto LAB_005cadb0;
      }
      poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)this_01,(char *)local_4f0,local_4e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,"in",2);
      poVar20 = (ostream *)std::ostream::operator<<(poVar20,(int)lVar27);
      std::__ostream_insert<char,std::char_traits<char>>(poVar20,".",1);
      if (pcVar19 == (char *)0x0) {
        std::ios::clear((int)poVar20 + (int)*(undefined8 *)(*(long *)poVar20 + -0x18));
      }
      else {
        sVar21 = strlen(pcVar19);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,pcVar19,sVar21);
      }
      psVar23 = this_01;
      if (uVar1 < 4) {
        lVar28 = 7;
        pcVar19 = " > 0.0)";
        if (iVar18 != 1) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,", vec",5);
          psVar23 = (string *)std::ostream::operator<<(this_01,iVar18);
          lVar28 = 6;
          pcVar19 = "(0.0))";
        }
LAB_005caeb6:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar23,pcVar19,lVar28);
      }
      else {
        lVar28 = 1;
        pcVar19 = ")";
        if (DVar5 - TYPE_INT < 8) goto LAB_005caeb6;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
      lVar27 = lVar27 + 1;
      puVar25 = puVar25 + 0x20;
      pSVar22 = local_4c0 + 1;
    } while (lVar27 < (this->m_spec).numInputs);
  }
  pcVar19 = glu::getDataTypeName((this->m_spec).output);
  DVar5 = (this->m_spec).output;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
  if ((local_558 != (char *)0x0) && (3 < DVar5 - TYPE_BOOL)) {
    sVar21 = strlen(local_558);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,local_558,sVar21);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," ",1);
  }
  if (pcVar19 == (char *)0x0) {
    std::ios::clear(iVar17 + (int)*(undefined8 *)((this_01->_M_dataplus)._M_p + -0x18));
  }
  else {
    sVar21 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar19,sVar21);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," res = ",7);
  if (pcVar19 == (char *)0x0) {
    std::ios::clear(iVar17 + (int)*(undefined8 *)((this_01->_M_dataplus)._M_p + -0x18));
  }
  else {
    sVar21 = strlen(pcVar19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar19,sVar21);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"(0.0);\n\n",8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\t",1);
  poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)this_01,(this->m_shaderOp)._M_dataplus._M_p,
                       (this->m_shaderOp)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar20,"\n\n",2);
  DVar5 = (this->m_spec).output;
  iVar17 = glu::getDataTypeScalarSize(DVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_01,"\thighp vec4 color = vec4(0.0, 0.0, 0.0, 1.0);\n",0x2e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tcolor.",7);
  lVar27 = (long)(iVar17 + -1);
  pcVar19 = *(char **)(sr::(anonymous_namespace)::s_outSwizzles + lVar27 * 8);
  sVar21 = strlen(pcVar19);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar19,sVar21);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," = ",3);
  bVar29 = 3 < DVar5 - TYPE_FLOAT;
  bVar30 = iVar17 != 1;
  pcVar19 = "float(res)";
  if (bVar30 || !bVar29) {
    pcVar19 = "res";
  }
  lVar28 = 10;
  if (bVar30 || !bVar29) {
    lVar28 = 3;
  }
  psVar23 = this_01;
  if (bVar30 && bVar29) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"vec",3);
    psVar23 = (string *)std::ostream::operator<<(this_01,iVar17);
    lVar28 = 5;
    pcVar19 = "(res)";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)psVar23,pcVar19,lVar28);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
  fVar2 = (this->m_spec).resultScale;
  fVar3 = (this->m_spec).resultBias;
  if ((((fVar2 != 1.0) || (NAN(fVar2))) || (fVar3 != 0.0)) || (NAN(fVar3))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"\tcolor = color",0xe);
    if ((fVar2 != 1.0) || (NAN(fVar2))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," * ",3);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
      std::ostream::_M_insert<double>((double)fVar2);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
      std::ios_base::~ios_base(local_428);
      local_498[0]._M_dataplus._M_p = (pointer)&local_498[0].field_2;
      local_498[0].field_2._M_allocated_capacity._0_4_ = 0x302e31;
      local_498[0]._M_string_length = 3;
      twoValuedVec4(&local_530,&local_510,local_498,
                    (BVec4 *)(sr::(anonymous_namespace)::s_outSwizzleChannelMasks + lVar27 * 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,local_530._M_dataplus._M_p,local_530._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,
                        CONCAT44(local_498[0].field_2._M_allocated_capacity._4_4_,
                                 (undefined4)local_498[0].field_2._M_allocated_capacity) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,
                        CONCAT44(local_510.field_2._M_allocated_capacity._4_4_,
                                 local_510.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    if ((fVar3 != 0.0) || (NAN(fVar3))) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01," + ",3);
      de::floatToString_abi_cxx11_(&local_530,(de *)0x2,fVar3,precision);
      local_510.field_2._M_allocated_capacity._0_4_ = 0x302e30;
      local_510._M_string_length = 3;
      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      twoValuedVec4(local_498,&local_530,&local_510,
                    (BVec4 *)(sr::(anonymous_namespace)::s_outSwizzleChannelMasks + lVar27 * 4));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,local_498[0]._M_dataplus._M_p,local_498[0]._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
        operator_delete(local_498[0]._M_dataplus._M_p,
                        CONCAT44(local_498[0].field_2._M_allocated_capacity._4_4_,
                                 (undefined4)local_498[0].field_2._M_allocated_capacity) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,
                        CONCAT44(local_510.field_2._M_allocated_capacity._4_4_,
                                 local_510.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_530._M_dataplus._M_p != &local_530.field_2) {
        operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,";\n",2);
  }
  if ((this->super_ShaderRenderCase).m_isVertexCase == false) {
    lVar27 = 0x12;
    pcVar19 = "\to_color = color;\n";
    if (0 < (this->m_spec).numInputs) {
      iVar17 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"\tv_in",5);
        poVar20 = (ostream *)std::ostream::operator<<(local_320,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20," = a_in",7);
        poVar20 = (ostream *)std::ostream::operator<<(poVar20,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar20,";\n",2);
        iVar17 = iVar17 + 1;
      } while (iVar17 < (this->m_spec).numInputs);
      lVar27 = 0x12;
      pcVar19 = "\to_color = color;\n";
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_320,"\tv_color = color;\n",0x12);
    lVar27 = 0x14;
    pcVar19 = "\to_color = v_color;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar19,lVar27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"}\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_vertShaderSource,(string *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,
                    CONCAT44(local_498[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_498[0].field_2._M_allocated_capacity) + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=
            ((string *)&(this->super_ShaderRenderCase).m_fragShaderSource,(string *)local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,
                    CONCAT44(local_498[0].field_2._M_allocated_capacity._4_4_,
                             (undefined4)local_498[0].field_2._M_allocated_capacity) + 1);
  }
  if (local_4f0 != local_4e0) {
    operator_delete(local_4f0,local_4e0[0] + 1);
  }
  if (local_550 != local_540) {
    operator_delete(local_550,(ulong)(local_540[0]->_M_local_buf + 1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  return;
}

Assistant:

ShaderOperatorCase::ShaderOperatorCase (tcu::TestContext&		testCtx,
										const char*				caseName,
										const char*				description,
										const bool				isVertexCase,
										const ShaderEvalFunc	evalFunc,
										const std::string&		shaderOp,
										const ShaderDataSpec&	spec)
	: ShaderRenderCase	(testCtx,
						 caseName,
						 description,
						 isVertexCase,
						 new OperatorShaderEvaluator(evalFunc, spec.referenceScale, spec.referenceBias, getDataTypeScalarSize(spec.output)),
						 DE_NULL,
						 DE_NULL)
	, m_spec			(spec)
	, m_shaderOp		(shaderOp)
{
	setupShaderData();
}